

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMarkowitz(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *m)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  int iVar5;
  cpp_dec_float<50U,_int,_void> local_58;
  
  if ((m->m_backend).fpclass != cpp_dec_float_NaN) {
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,0.0001);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&m->m_backend,&local_58);
    if (iVar5 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)m,0.0001);
    }
    if ((m->m_backend).fpclass != cpp_dec_float_NaN) {
      local_58.fpclass = cpp_dec_float_finite;
      local_58.prec_elem = 10;
      local_58.data._M_elems[0] = 0;
      local_58.data._M_elems[1] = 0;
      local_58.data._M_elems[2] = 0;
      local_58.data._M_elems[3] = 0;
      local_58.data._M_elems[4] = 0;
      local_58.data._M_elems[5] = 0;
      local_58.data._M_elems._24_5_ = 0;
      local_58.data._M_elems[7]._1_3_ = 0;
      local_58.data._M_elems._32_5_ = 0;
      local_58._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_58,0.9999);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&m->m_backend,&local_58);
      if (0 < iVar5) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)m,0.9999);
      }
    }
  }
  *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 8) =
       *(undefined8 *)((m->m_backend).data._M_elems + 8);
  uVar1 = *(undefined8 *)(m->m_backend).data._M_elems;
  uVar2 = *(undefined8 *)((m->m_backend).data._M_elems + 2);
  uVar3 = *(undefined8 *)((m->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 4) =
       *(undefined8 *)((m->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->minThreshold).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 2) = uVar2;
  (this->minThreshold).m_backend.exp = (m->m_backend).exp;
  (this->minThreshold).m_backend.neg = (m->m_backend).neg;
  iVar4 = (m->m_backend).prec_elem;
  (this->minThreshold).m_backend.fpclass = (m->m_backend).fpclass;
  (this->minThreshold).m_backend.prec_elem = iVar4;
  uVar1 = *(undefined8 *)((m->m_backend).data._M_elems + 2);
  uVar2 = *(undefined8 *)((m->m_backend).data._M_elems + 4);
  uVar3 = *(undefined8 *)((m->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->lastThreshold).m_backend.data._M_elems =
       *(undefined8 *)(m->m_backend).data._M_elems;
  *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8) =
       *(undefined8 *)((m->m_backend).data._M_elems + 8);
  (this->lastThreshold).m_backend.exp = (m->m_backend).exp;
  (this->lastThreshold).m_backend.neg = (m->m_backend).neg;
  iVar4 = (m->m_backend).prec_elem;
  (this->lastThreshold).m_backend.fpclass = (m->m_backend).fpclass;
  (this->lastThreshold).m_backend.prec_elem = iVar4;
  return;
}

Assistant:

void setMarkowitz(R m)
   {
      if(m < 0.0001)
         m = 0.0001;

      if(m > 0.9999)
         m = 0.9999;

      minThreshold = m;
      lastThreshold = m;
   }